

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

action * action_remove_queue_head(void)

{
  action *paVar1;
  
  if (action_queue.next == &action_queue) {
    paVar1 = (action *)0x0;
  }
  else {
    paVar1 = (action *)(action_queue.next + -1);
    list_remove(action_queue.next);
  }
  return paVar1;
}

Assistant:

struct action *action_remove_queue_head(void)
{
    if (list_empty(&action_queue)) {
        return 0;
    } else {
        struct listnode *node = list_head(&action_queue);
        struct action *act = node_to_item(node, struct action, qlist);
        list_remove(node);
        return act;
    }
}